

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

ExpEmit __thiscall FxConcat::Emit(FxConcat *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  PType *pPVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint extraout_var;
  uint extraout_var_00;
  int iVar7;
  uint opc;
  byte bVar8;
  uint uVar9;
  byte bVar10;
  byte bVar11;
  ExpEmit EVar12;
  bool bVar13;
  bool bVar14;
  uint local_48;
  
  uVar3 = (*((this->super_FxBinary).left)->_vptr_FxExpression[9])();
  pFVar1 = (this->super_FxBinary).right;
  uVar4 = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
  bVar11 = (byte)(uVar3 >> 0x10);
  if (bVar11 == 2) {
    bVar13 = (extraout_var & 1) == 0;
    if (bVar13) {
      local_48 = uVar3 >> 0x18;
      uVar5 = uVar3;
    }
    else {
      local_48 = 1;
      uVar5 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 2,1);
      VMFunctionBuilder::Emit(build,4,uVar5 & 0xffff,(VM_SHALF)uVar3);
    }
    bVar13 = bVar13 && (extraout_var & 0x101) != 0;
  }
  else {
    bVar13 = (extraout_var & 0x100) != 0;
    uVar5 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 2,1);
    if ((extraout_var & 1) == 0) {
      uVar9 = uVar3 >> 0x18;
      uVar6 = uVar3;
    }
    else {
      uVar6 = VMFunctionBuilder::RegAvailability::Get
                        (build->Registers + (((ulong)uVar3 & 0xff0000) >> 0x10),1);
      iVar7 = 2;
      if (bVar11 != 0) {
        iVar7 = (uint)(bVar11 != 1) * 2 + 3;
      }
      VMFunctionBuilder::Emit(build,iVar7,uVar6 & 0xffff,(VM_SHALF)uVar3);
      uVar9 = 1;
      bVar13 = false;
    }
    if (bVar11 == 1) {
      opc = 6;
      if ((char)uVar9 != '\x01') {
        opc = (char)uVar9 == '\x02' ^ 0x11;
      }
    }
    else {
      pPVar2 = ((this->super_FxBinary).left)->ValueType;
      if (pPVar2 == (PType *)TypeUInt32) {
        opc = 3;
      }
      else if (pPVar2 == (PType *)TypeName) {
        opc = 0xb;
      }
      else if (pPVar2 == (PType *)TypeSound) {
        opc = 0xf;
      }
      else if (pPVar2 == (PType *)TypeColor) {
        opc = 0xe;
      }
      else if (pPVar2 == (PType *)TypeSpriteID) {
        opc = 0x12;
      }
      else if (pPVar2 == (PType *)TypeTextureID) {
        opc = 0x13;
      }
      else {
        opc = 7;
        if (bVar11 != 3) {
          if ((uVar3 >> 0x10 & 0xff) != 0) {
            __assert_fail("false && \"Bad type for string concatenation\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                          ,0xf9c,"virtual ExpEmit FxConcat::Emit(VMFunctionBuilder *)");
          }
          opc = 1;
        }
      }
    }
    VMFunctionBuilder::Emit(build,0x3e,uVar5 & 0xffff,uVar6 & 0xffff,opc);
    local_48 = 1;
    if (!bVar13 && bVar11 < 4) {
      VMFunctionBuilder::RegAvailability::Return
                (build->Registers + ((uint)(CONCAT44(extraout_var,uVar3) >> 0x10) & 3),
                 uVar6 & 0xffff,uVar9);
    }
    bVar13 = false;
  }
  bVar11 = (byte)(uVar4 >> 0x10);
  if (bVar11 == 2) {
    if ((extraout_var_00 & 1) == 0) {
      uVar9 = (uint)(CONCAT44(extraout_var_00,uVar4) >> 0x18) & 0xff;
      bVar14 = (extraout_var_00 & 0x100) != 0;
      uVar3 = uVar4;
    }
    else {
      uVar9 = 1;
      uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 2,1);
      VMFunctionBuilder::Emit(build,4,uVar3 & 0xffff,(VM_SHALF)uVar4);
      bVar14 = false;
    }
  }
  else {
    uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 2,1);
    if ((extraout_var_00 & 1) == 0) {
      bVar10 = (byte)(uVar4 >> 0x18);
      bVar8 = (byte)(extraout_var_00 >> 8) & 1;
      uVar6 = uVar4;
    }
    else {
      uVar6 = VMFunctionBuilder::RegAvailability::Get
                        (build->Registers + (((ulong)uVar4 & 0xff0000) >> 0x10),1);
      iVar7 = 2;
      if (bVar11 != 0) {
        iVar7 = (uint)(bVar11 != 1) * 2 + 3;
      }
      VMFunctionBuilder::Emit(build,iVar7,uVar6 & 0xffff,(VM_SHALF)uVar4);
      bVar10 = 1;
      bVar8 = 0;
    }
    if (bVar11 == 1) {
      uVar9 = 6;
      if (bVar10 != 1) {
        uVar9 = bVar10 == 2 ^ 0x11;
      }
    }
    else {
      pPVar2 = ((this->super_FxBinary).right)->ValueType;
      if (pPVar2 == (PType *)TypeUInt32) {
        uVar9 = 3;
      }
      else if (pPVar2 == (PType *)TypeName) {
        uVar9 = 0xb;
      }
      else if (pPVar2 == (PType *)TypeSound) {
        uVar9 = 0xf;
      }
      else if (pPVar2 == (PType *)TypeColor) {
        uVar9 = 0xe;
      }
      else if (pPVar2 == (PType *)TypeSpriteID) {
        uVar9 = 0x12;
      }
      else if (pPVar2 == (PType *)TypeTextureID) {
        uVar9 = 0x13;
      }
      else {
        uVar9 = 7;
        if (bVar11 != 3) {
          if ((uVar4 & 0xff0000) != 0) {
            __assert_fail("false && \"Bad type for string concatenation\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                          ,0xfbd,"virtual ExpEmit FxConcat::Emit(VMFunctionBuilder *)");
          }
          uVar9 = 1;
        }
      }
    }
    VMFunctionBuilder::Emit(build,0x3e,uVar3 & 0xffff,uVar6 & 0xffff,uVar9);
    uVar9 = 1;
    if (bVar8 == 0 && bVar11 < 4) {
      VMFunctionBuilder::RegAvailability::Return
                (build->Registers + ((uint)(CONCAT44(extraout_var_00,uVar4) >> 0x10) & 3),
                 uVar6 & 0xffff,(uint)bVar10);
    }
    bVar14 = false;
  }
  if (!bVar13) {
    VMFunctionBuilder::RegAvailability::Return(build->Registers + 2,uVar5 & 0xffff,local_48);
  }
  if (!bVar14) {
    VMFunctionBuilder::RegAvailability::Return(build->Registers + 2,uVar3 & 0xffff,uVar9);
  }
  uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 2,1);
  VMFunctionBuilder::Emit(build,0x57,uVar4 & 0xffff,uVar5 & 0xffff,uVar3 & 0xffff);
  EVar12._0_4_ = uVar4 & 0xffff | 0x1020000;
  EVar12.Konst = false;
  EVar12.Fixed = false;
  EVar12.Final = false;
  EVar12.Target = false;
  return EVar12;
}

Assistant:

ExpEmit FxConcat::Emit(VMFunctionBuilder *build)
{
	ExpEmit op1 = left->Emit(build);
	ExpEmit op2 = right->Emit(build);
	ExpEmit strng, strng2;

	if (op1.RegType == REGT_STRING && op1.Konst)
	{
		strng = ExpEmit(build, REGT_STRING);
		build->Emit(OP_LKS, strng.RegNum, op1.RegNum);
	}
	else if (op1.RegType == REGT_STRING)
	{
		strng = op1;
	}
	else
	{
		int cast;
		strng = ExpEmit(build, REGT_STRING);
		if (op1.Konst)
		{
			ExpEmit nonconst(build, op1.RegType);
			build->Emit(op1.RegType == REGT_INT ? OP_LK : op1.RegType == REGT_FLOAT ? OP_LKF : OP_LKP, nonconst.RegNum, op1.RegNum);
			op1 = nonconst;
		}
		if (op1.RegType == REGT_FLOAT) cast = op1.RegCount == 1 ? CAST_F2S : op1.RegCount == 2 ? CAST_V22S : CAST_V32S;
		else if (left->ValueType == TypeUInt32) cast = CAST_U2S;
		else if (left->ValueType == TypeName) cast = CAST_N2S;
		else if (left->ValueType == TypeSound) cast = CAST_So2S;
		else if (left->ValueType == TypeColor) cast = CAST_Co2S;
		else if (left->ValueType == TypeSpriteID) cast = CAST_SID2S;
		else if (left->ValueType == TypeTextureID) cast = CAST_TID2S;
		else if (op1.RegType == REGT_POINTER) cast = CAST_P2S;
		else if (op1.RegType == REGT_INT) cast = CAST_I2S;
		else assert(false && "Bad type for string concatenation");
		build->Emit(OP_CAST, strng.RegNum, op1.RegNum, cast);
		op1.Free(build);
	}

	if (op2.RegType == REGT_STRING && op2.Konst)
	{
		strng2 = ExpEmit(build, REGT_STRING);
		build->Emit(OP_LKS, strng2.RegNum, op2.RegNum);
	}
	else if (op2.RegType == REGT_STRING)
	{
		strng2 = op2;
	}
	else
	{
		int cast;
		strng2 = ExpEmit(build, REGT_STRING);
		if (op2.Konst)
		{
			ExpEmit nonconst(build, op2.RegType);
			build->Emit(op2.RegType == REGT_INT ? OP_LK : op2.RegType == REGT_FLOAT ? OP_LKF : OP_LKP, nonconst.RegNum, op2.RegNum);
			op2 = nonconst;
		}
		if (op2.RegType == REGT_FLOAT) cast = op2.RegCount == 1 ? CAST_F2S : op2.RegCount == 2 ? CAST_V22S : CAST_V32S;
		else if (right->ValueType == TypeUInt32) cast = CAST_U2S;
		else if (right->ValueType == TypeName) cast = CAST_N2S;
		else if (right->ValueType == TypeSound) cast = CAST_So2S;
		else if (right->ValueType == TypeColor) cast = CAST_Co2S;
		else if (right->ValueType == TypeSpriteID) cast = CAST_SID2S;
		else if (right->ValueType == TypeTextureID) cast = CAST_TID2S;
		else if (op2.RegType == REGT_POINTER) cast = CAST_P2S;
		else if (op2.RegType == REGT_INT) cast = CAST_I2S;
		else assert(false && "Bad type for string concatenation");
		build->Emit(OP_CAST, strng2.RegNum, op2.RegNum, cast);
		op2.Free(build);
	}
	strng.Free(build);
	strng2.Free(build);
	ExpEmit dest(build, REGT_STRING);
	assert(strng.RegType == strng2.RegType && strng.RegType == REGT_STRING);
	build->Emit(OP_CONCAT, dest.RegNum, strng.RegNum, strng2.RegNum);
	return dest;
}